

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

void __thiscall
ON_SimpleArray<ON_ColorStop>::Append(ON_SimpleArray<ON_ColorStop> *this,ON_ColorStop *x)

{
  double dVar1;
  undefined4 uVar2;
  int iVar3;
  ON_ColorStop *pOVar4;
  ON_ColorStop *pOVar5;
  
  iVar3 = this->m_count;
  pOVar4 = x;
  if (iVar3 == this->m_capacity) {
    iVar3 = NewCapacity(this);
    if ((this->m_a <= x) && (x < this->m_a + this->m_capacity)) {
      pOVar4 = (ON_ColorStop *)onmalloc(0x10);
      uVar2 = *(undefined4 *)&x->field_0x4;
      dVar1 = x->m_position;
      pOVar4->m_color = (ON_Color)(x->m_color).field_0;
      *(undefined4 *)&pOVar4->field_0x4 = uVar2;
      pOVar4->m_position = dVar1;
    }
    Reserve(this,(long)iVar3);
    pOVar5 = this->m_a;
    if (pOVar5 == (ON_ColorStop *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
    iVar3 = this->m_count;
  }
  else {
    pOVar5 = this->m_a;
  }
  this->m_count = iVar3 + 1;
  uVar2 = *(undefined4 *)&pOVar4->field_0x4;
  dVar1 = pOVar4->m_position;
  pOVar5 = pOVar5 + iVar3;
  pOVar5->m_color = (ON_Color)(pOVar4->m_color).field_0;
  *(undefined4 *)&pOVar5->field_0x4 = uVar2;
  pOVar5->m_position = dVar1;
  if (pOVar4 != x) {
    onfree(pOVar4);
    return;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}